

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void wabt::WriteDebugName(Stream *stream,string_view name,char *desc)

{
  bool bVar1;
  const_reference pcVar2;
  PrintChars in_R9D;
  string_view s;
  undefined1 local_38 [8];
  string_view stripped_name;
  char *desc_local;
  Stream *stream_local;
  string_view name_local;
  
  stripped_name.data_ = (char *)name.size_;
  local_38 = (undefined1  [8])name.data_;
  stripped_name.size_ = (size_type)desc;
  bVar1 = string_view::empty((string_view *)local_38);
  if (!bVar1) {
    pcVar2 = string_view::front((string_view *)local_38);
    if (*pcVar2 != '$') {
      __assert_fail("stripped_name.front() == \'$\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-writer.cc"
                    ,0x4b,"void wabt::WriteDebugName(Stream *, string_view, const char *)");
    }
    string_view::remove_prefix((string_view *)local_38,1);
  }
  s.size_ = stripped_name.size_;
  s.data_ = stripped_name.data_;
  WriteStr((wabt *)stream,(Stream *)local_38,s,&DAT_00000001,in_R9D);
  return;
}

Assistant:

void WriteDebugName(Stream* stream, string_view name, const char* desc) {
  string_view stripped_name = name;
  if (!stripped_name.empty()) {
    // Strip leading $ from name
    assert(stripped_name.front() == '$');
    stripped_name.remove_prefix(1);
  }
  WriteStr(stream, stripped_name, desc, PrintChars::Yes);
}